

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O1

int IoTHubTransportHttp_GetSupportedPlatformInfo
              (TRANSPORT_LL_HANDLE handle,PLATFORM_INFO_OPTION *info)

{
  if (handle != (TRANSPORT_LL_HANDLE)0x0) {
    *info = PLATFORM_INFO_OPTION_DEFAULT;
    return 0;
  }
  return 0x8d8;
}

Assistant:

static int IoTHubTransportHttp_GetSupportedPlatformInfo(TRANSPORT_LL_HANDLE handle, PLATFORM_INFO_OPTION* info)
{
    int result;
    if (handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        *info = PLATFORM_INFO_OPTION_DEFAULT;
        result = 0;
    }

    return result;
}